

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall spvtools::val::ValidationState_t::IsVoidType(ValidationState_t *this,uint32_t id)

{
  Instruction *pIVar1;
  bool bVar2;
  
  pIVar1 = FindDef(this,id);
  if (pIVar1 == (Instruction *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = (pIVar1->inst_).opcode == 0x13;
  }
  return bVar2;
}

Assistant:

bool ValidationState_t::IsVoidType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  return inst && inst->opcode() == spv::Op::OpTypeVoid;
}